

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O2

int mm_read_banner(FILE *f,MM_typecode *matcode)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  __int32_t **pp_Var5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char storage_scheme [64];
  char data_type [64];
  char crd [64];
  char mtx [64];
  char banner [64];
  char line [1025];
  
  *matcode = (MM_typecode)0x47202020;
  pcVar4 = fgets(line,0x401,(FILE *)f);
  iVar3 = 0xc;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = storage_scheme;
    pcVar6 = mtx;
    pcVar8 = crd;
    pcVar7 = data_type;
    iVar2 = __isoc99_sscanf(line,"%s %s %s %s %s",banner,pcVar6,pcVar8,pcVar7,pcVar4);
    if (iVar2 == 5) {
      for (; cVar1 = *pcVar6, (long)cVar1 != 0; pcVar6 = pcVar6 + 1) {
        pp_Var5 = __ctype_tolower_loc();
        *pcVar6 = (char)(*pp_Var5)[cVar1];
      }
      for (; cVar1 = *pcVar8, (long)cVar1 != 0; pcVar8 = pcVar8 + 1) {
        pp_Var5 = __ctype_tolower_loc();
        *pcVar8 = (char)(*pp_Var5)[cVar1];
      }
      for (; cVar1 = *pcVar7, (long)cVar1 != 0; pcVar7 = pcVar7 + 1) {
        pp_Var5 = __ctype_tolower_loc();
        *pcVar7 = (char)(*pp_Var5)[cVar1];
      }
      for (; cVar1 = *pcVar4, (long)cVar1 != 0; pcVar4 = pcVar4 + 1) {
        pp_Var5 = __ctype_tolower_loc();
        *pcVar4 = (char)(*pp_Var5)[cVar1];
      }
      iVar3 = bcmp(banner,"%%MatrixMarket",0xe);
      if (iVar3 == 0) {
        iVar2 = bcmp(mtx,"matrix",7);
        iVar3 = 0xf;
        if (iVar2 == 0) {
          (*matcode)[0] = 'M';
          iVar3 = bcmp(crd,"coordinate",0xb);
          if (iVar3 == 0) {
            cVar1 = 'C';
          }
          else {
            iVar3 = bcmp(crd,"array",6);
            if (iVar3 != 0) {
              return 0xf;
            }
            cVar1 = 'A';
          }
          (*matcode)[1] = cVar1;
          iVar3 = bcmp(data_type,"real",5);
          if (iVar3 == 0) {
            cVar1 = 'R';
          }
          else if (data_type._0_8_ == 0x78656c706d6f63) {
            cVar1 = 'C';
          }
          else if (data_type._0_8_ == 0x72656765746e69) {
            cVar1 = 'I';
          }
          else {
            if (data_type._0_8_ != 0x6e726574746170) {
              return 0xf;
            }
            cVar1 = 'P';
          }
          (*matcode)[2] = cVar1;
          cVar1 = 'G';
          if (storage_scheme._0_8_ != 0x6c6172656e6567) {
            iVar3 = bcmp(storage_scheme,"symmetric",10);
            if (iVar3 == 0) {
              cVar1 = 'S';
            }
            else {
              iVar3 = bcmp(storage_scheme,"hermitian",10);
              if (iVar3 == 0) {
                cVar1 = 'H';
              }
              else {
                iVar3 = bcmp(storage_scheme,"skew-symmetric",0xf);
                if (iVar3 != 0) {
                  return 0xf;
                }
                cVar1 = 'K';
              }
            }
          }
          (*matcode)[3] = cVar1;
          iVar3 = 0;
        }
      }
      else {
        iVar3 = 0xe;
      }
    }
  }
  return iVar3;
}

Assistant:

int mm_read_banner(FILE *f, MM_typecode *matcode) {
    char line[MM_MAX_LINE_LENGTH];
    char banner[MM_MAX_TOKEN_LENGTH];
    char mtx[MM_MAX_TOKEN_LENGTH];
    char crd[MM_MAX_TOKEN_LENGTH];
    char data_type[MM_MAX_TOKEN_LENGTH];
    char storage_scheme[MM_MAX_TOKEN_LENGTH];
    char *p;


    mm_clear_typecode(matcode);

    if (fgets(line, MM_MAX_LINE_LENGTH, f) == NULL)
        return MM_PREMATURE_EOF;

    if (sscanf(line, "%s %s %s %s %s", banner, mtx, crd, data_type,
               storage_scheme) != 5)
        return MM_PREMATURE_EOF;

    for (p = mtx; *p != '\0'; *p = tolower(*p), p++);  /* convert to lower case */
    for (p = crd; *p != '\0'; *p = tolower(*p), p++);
    for (p = data_type; *p != '\0'; *p = tolower(*p), p++);
    for (p = storage_scheme; *p != '\0'; *p = tolower(*p), p++);

    /* check for banner */
    if (strncmp(banner, MatrixMarketBanner, strlen(MatrixMarketBanner)) != 0)
        return MM_NO_HEADER;

    /* first field should be "mtx" */
    if (strcmp(mtx, MM_MTX_STR) != 0)
        return MM_UNSUPPORTED_TYPE;
    mm_set_matrix(matcode);


    /* second field describes whether this is a sparse matrix (in coordinate
            storgae) or a dense array */


    if (strcmp(crd, MM_SPARSE_STR) == 0)
        mm_set_sparse(matcode);
    else if (strcmp(crd, MM_DENSE_STR) == 0)
        mm_set_dense(matcode);
    else
        return MM_UNSUPPORTED_TYPE;


    /* third field */

    if (strcmp(data_type, MM_REAL_STR) == 0)
        mm_set_real(matcode);
    else if (strcmp(data_type, MM_COMPLEX_STR) == 0)
        mm_set_complex(matcode);
    else if (strcmp(data_type, MM_PATTERN_STR) == 0)
        mm_set_pattern(matcode);
    else if (strcmp(data_type, MM_INT_STR) == 0)
        mm_set_integer(matcode);
    else
        return MM_UNSUPPORTED_TYPE;


    /* fourth field */

    if (strcmp(storage_scheme, MM_GENERAL_STR) == 0)
        mm_set_general(matcode);
    else if (strcmp(storage_scheme, MM_SYMM_STR) == 0)
        mm_set_symmetric(matcode);
    else if (strcmp(storage_scheme, MM_HERM_STR) == 0)
        mm_set_hermitian(matcode);
    else if (strcmp(storage_scheme, MM_SKEW_STR) == 0)
        mm_set_skew(matcode);
    else
        return MM_UNSUPPORTED_TYPE;


    return 0;
}